

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNErrCode SUNLinSolSetATimes_SPBCGS(SUNLinearSolver S,void *ATData,SUNATimesFn ATimes)

{
  SUNContext_conflict sunctx_local_scope_;
  SUNATimesFn ATimes_local;
  void *ATData_local;
  SUNLinearSolver S_local;
  
  *(SUNATimesFn *)((long)S->content + 0x20) = ATimes;
  *(void **)((long)S->content + 0x28) = ATData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetATimes_SPBCGS(SUNLinearSolver S, void* ATData,
                                     SUNATimesFn ATimes)
{
  SUNFunctionBegin(S->sunctx);
  /* set function pointers to integrator-supplied ATimes routine
     and data, and return with success */
  SPBCGS_CONTENT(S)->ATimes = ATimes;
  SPBCGS_CONTENT(S)->ATData = ATData;
  return SUN_SUCCESS;
}